

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsnode_bmod.c
# Opt level: O1

int zsnode_bmod(int jcol,int jsupno,int fsupc,doublecomplex *dense,doublecomplex *tempv,
               GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  flops_t *pfVar4;
  int_t *piVar5;
  void *pvVar6;
  int_t *piVar7;
  int_t *piVar8;
  uint nrow;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int ldm;
  doublecomplex *rhs;
  long lVar13;
  double *pdVar14;
  
  pfVar4 = stat->ops;
  piVar5 = Glu->xlsub;
  pvVar6 = Glu->lusup;
  piVar7 = Glu->xlusup;
  iVar12 = piVar7[jcol];
  lVar13 = (long)piVar5[fsupc];
  if (piVar5[fsupc] < piVar5[(long)fsupc + 1]) {
    piVar8 = Glu->lsub;
    pdVar14 = (double *)((long)iVar12 * 0x10 + (long)pvVar6);
    do {
      iVar3 = piVar8[lVar13];
      dVar2 = dense[iVar3].i;
      *pdVar14 = dense[iVar3].r;
      pdVar14[1] = dVar2;
      dense[iVar3].r = 0.0;
      dense[iVar3].i = 0.0;
      lVar13 = lVar13 + 1;
      pdVar14 = pdVar14 + 2;
      iVar12 = iVar12 + 1;
    } while (lVar13 < piVar5[(long)fsupc + 1]);
  }
  piVar7[(long)jcol + 1] = iVar12;
  iVar12 = jcol - fsupc;
  if (iVar12 != 0 && fsupc <= jcol) {
    iVar3 = piVar7[fsupc];
    ldm = piVar5[(long)fsupc + 1] - piVar5[fsupc];
    nrow = ldm - iVar12;
    iVar9 = piVar7[jcol];
    pfVar4[0x13] = (float)((iVar12 + -1) * iVar12 * 4) + pfVar4[0x13];
    pfVar4[0x14] = (float)(int)(iVar12 * nrow * 8) + pfVar4[0x14];
    rhs = (doublecomplex *)((long)iVar9 * 0x10 + (long)pvVar6);
    zlsolve(ldm,iVar12,(doublecomplex *)((long)iVar3 * 0x10 + (long)pvVar6),rhs);
    zmatvec(ldm,nrow,iVar12,(doublecomplex *)(((long)iVar3 + (long)iVar12) * 0x10 + (long)pvVar6),
            rhs,tempv);
    if (0 < (int)nrow) {
      iVar9 = iVar9 + iVar12;
      lVar13 = (long)iVar9 * 0x10 + 8;
      lVar10 = 0;
      uVar11 = 0;
      do {
        dVar2 = *(double *)((long)pvVar6 + lVar10 + lVar13);
        *(double *)((long)pvVar6 + lVar10 + (long)iVar9 * 0x10) =
             *(double *)((long)pvVar6 + lVar10 + (long)iVar9 * 0x10) -
             *(double *)((long)&tempv->r + lVar10);
        *(double *)((long)pvVar6 + lVar10 + lVar13) = dVar2 - *(double *)((long)&tempv->i + lVar10);
        puVar1 = (undefined8 *)((long)&tempv->r + lVar10);
        *puVar1 = 0;
        puVar1[1] = 0;
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while (uVar11 < nrow);
    }
  }
  return 0;
}

Assistant:

int
zsnode_bmod (
	    const int  jcol,	  /* in */
	    const int  jsupno,    /* in */
	    const int  fsupc,     /* in */
	    doublecomplex     *dense,    /* in */
	    doublecomplex     *tempv,    /* working array */
	    GlobalLU_t *Glu,      /* modified */
	    SuperLUStat_t *stat   /* output */
	    )
{
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int            incx = 1, incy = 1;
    doublecomplex         alpha = {-1.0, 0.0},  beta = {1.0, 0.0};
#endif

    doublecomplex   comp_zero = {0.0, 0.0};
    int     nsupc, nsupr, nrow;
    int_t   isub, irow;
    int_t   ufirst, nextlu;
    int_t   *lsub, *xlsub;
    doublecomplex *lusup;
    int_t   *xlusup, luptr;
    flops_t *ops = stat->ops;

    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;

    nextlu = xlusup[jcol];
    
    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = comp_zero;
	++nextlu;
    }

    xlusup[jcol + 1] = nextlu;	/* Initialize xlusup for next column */
    
    if ( fsupc < jcol ) {

	luptr = xlusup[fsupc];
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nsupc = jcol - fsupc;	/* Excluding jcol */
	ufirst = xlusup[jcol];	/* Points to the beginning of column
				   jcol in supernode L\U(jsupno). */
	nrow = nsupr - nsupc;

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	ztrsv_( "L", "N", "U", &nsupc, &lusup[luptr], &nsupr, 
	      &lusup[ufirst], &incx );
	zgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr, 
		&lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	zlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );
	zmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc], 
			&lusup[ufirst], &tempv[0] );

	int_t i, iptr; 
        /* Scatter tempv[*] into lusup[*] */
	iptr = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    z_sub(&lusup[iptr], &lusup[iptr], &tempv[i]);
            ++iptr;
	    tempv[i] = comp_zero;
	}
#endif

    }

    return 0;
}